

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool Json::parseFromStream(Factory *fact,istream *sin,Value *root,string *errs)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  string doc;
  ostringstream ssin;
  long local_1c0;
  long local_1b8;
  ostringstream local_1a0 [376];
  long *plVar3;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::ostream::operator<<(local_1a0,*(streambuf **)(sin + *(long *)(*(long *)sin + -0x18) + 0xe8));
  std::__cxx11::stringbuf::str();
  iVar2 = (*fact->_vptr_Factory[2])(fact);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  uVar1 = (**(code **)(*plVar3 + 0x10))(plVar3,local_1c0,local_1b8 + local_1c0,root,errs);
  (**(code **)(*plVar3 + 8))(plVar3);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return (bool)uVar1;
}

Assistant:

bool parseFromStream(
    CharReader::Factory const& fact, JSONCPP_ISTREAM& sin,
    Value* root, JSONCPP_STRING* errs)
{
  JSONCPP_OSTRINGSTREAM ssin;
  ssin << sin.rdbuf();
  JSONCPP_STRING doc = ssin.str();
  char const* begin = doc.data();
  char const* end = begin + doc.size();
  // Note that we do not actually need a null-terminator.
  CharReaderPtr const reader(fact.newCharReader());
  return reader->parse(begin, end, root, errs);
}